

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# submit-3AddBeforeQuery.cpp
# Opt level: O3

void AddPointFromAddBeforeQuery(int id,double x,double y)

{
  long lVar1;
  
  lVar1 = (long)Point_cnt;
  Point_id[lVar1] = id;
  Point[lVar1].first = x;
  Point[lVar1].second = y;
  Point_cnt = Point_cnt + 1;
  return;
}

Assistant:

void AddPointFromAddBeforeQuery(int id, double x, double y) {
    Point[Point_cnt] = {x, y};
    Point_id[Point_cnt] = id;
    Point_cnt ++;
}